

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall pybind11::module::module(module *this,char *name,char *doc)

{
  bool bVar1;
  PyObject *pPVar2;
  PyModuleDef *def;
  char *local_20;
  char *doc_local;
  char *name_local;
  module *this_local;
  
  object::object(&this->super_object);
  bVar1 = options::show_user_defined_docstrings();
  local_20 = doc;
  if (!bVar1) {
    local_20 = (char *)0x0;
  }
  pPVar2 = (PyObject *)operator_new(0x68);
  pPVar2[5].ob_refcnt = 0;
  pPVar2[5].ob_type = (PyTypeObject *)0x0;
  pPVar2[4].ob_refcnt = 0;
  pPVar2[4].ob_type = (PyTypeObject *)0x0;
  pPVar2[3].ob_refcnt = 0;
  pPVar2[3].ob_type = (PyTypeObject *)0x0;
  pPVar2[2].ob_refcnt = 0;
  pPVar2[2].ob_type = (PyTypeObject *)0x0;
  pPVar2[1].ob_refcnt = 0;
  pPVar2[1].ob_type = (PyTypeObject *)0x0;
  pPVar2->ob_refcnt = 0;
  pPVar2->ob_type = (PyTypeObject *)0x0;
  pPVar2[6].ob_refcnt = 0;
  pPVar2[5].ob_refcnt = 0;
  pPVar2[5].ob_type = (PyTypeObject *)0x0;
  pPVar2[4].ob_refcnt = 0;
  pPVar2[4].ob_type = (PyTypeObject *)0x0;
  pPVar2[3].ob_refcnt = 0;
  pPVar2[3].ob_type = (PyTypeObject *)0x0;
  pPVar2[2].ob_refcnt = 0;
  pPVar2[2].ob_type = (PyTypeObject *)0x0;
  pPVar2[1].ob_refcnt = 0;
  pPVar2[1].ob_type = (PyTypeObject *)0x0;
  pPVar2->ob_refcnt = 0;
  pPVar2->ob_type = (PyTypeObject *)0x0;
  pPVar2[6].ob_refcnt = 0;
  pPVar2[2].ob_type = (PyTypeObject *)name;
  pPVar2[3].ob_refcnt = (Py_ssize_t)local_20;
  pPVar2[3].ob_type = (PyTypeObject *)0xffffffffffffffff;
  _Py_INCREF(pPVar2);
  pPVar2 = (PyObject *)PyModule_Create2(pPVar2,0x3f5);
  (this->super_object).super_handle.m_ptr = pPVar2;
  if ((this->super_object).super_handle.m_ptr == (PyObject *)0x0) {
    pybind11_fail("Internal error in module::module()");
  }
  handle::inc_ref((handle *)this);
  return;
}

Assistant:

explicit module(const char *name, const char *doc = nullptr) {
        if (!options::show_user_defined_docstrings()) doc = nullptr;
#if PY_MAJOR_VERSION >= 3
        PyModuleDef *def = new PyModuleDef();
        std::memset(def, 0, sizeof(PyModuleDef));
        def->m_name = name;
        def->m_doc = doc;
        def->m_size = -1;
        Py_INCREF(def);
        m_ptr = PyModule_Create(def);
#else
        m_ptr = Py_InitModule3(name, nullptr, doc);
#endif
        if (m_ptr == nullptr)
            pybind11_fail("Internal error in module::module()");
        inc_ref();
    }